

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O0

double bddAnnotateMintermCount(DdManager *manager,DdNode *node,double max,st__table *table)

{
  int iVar1;
  double dVar2;
  char *local_70;
  double *dummy;
  double *pmin;
  double min_N;
  double min_nv;
  double min_v;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  st__table *table_local;
  double max_local;
  DdNode *node_local;
  DdManager *manager_local;
  
  Nv = (DdNode *)((ulong)node & 0xfffffffffffffffe);
  if (Nv->index == 0x7fffffff) {
    manager_local = (DdManager *)max;
    if (node != manager->one) {
      manager_local = (DdManager *)0x0;
    }
  }
  else {
    N = (DdNode *)table;
    table_local = (st__table *)max;
    max_local = (double)node;
    node_local = &manager->sentinel;
    iVar1 = st__lookup(table,(char *)node,&local_70);
    if (iVar1 == 0) {
      Nnv = (Nv->type).kids.T;
      min_v = (double)(Nv->type).kids.E;
      if (Nv != (DdNode *)max_local) {
        Nnv = (DdNode *)((ulong)Nnv ^ 1);
        min_v = (double)((ulong)min_v ^ 1);
      }
      dVar2 = bddAnnotateMintermCount
                        ((DdManager *)node_local,Nnv,(double)table_local,(st__table *)N);
      min_nv = dVar2 / 2.0;
      if ((min_nv != -1.0) || (NAN(min_nv))) {
        dVar2 = bddAnnotateMintermCount
                          ((DdManager *)node_local,(DdNode *)min_v,(double)table_local,
                           (st__table *)N);
        min_N = dVar2 / 2.0;
        if ((min_N != -1.0) || (NAN(min_N))) {
          pmin = (double *)(min_nv + min_N);
          dummy = (double *)malloc(8);
          if (dummy == (double *)0x0) {
            *(undefined4 *)((long)&node_local[0xf].type + 8) = 1;
            manager_local = (DdManager *)0xbff0000000000000;
          }
          else {
            *dummy = (double)pmin;
            iVar1 = st__insert((st__table *)N,(char *)max_local,(char *)dummy);
            if (iVar1 == -10000) {
              if (dummy != (double *)0x0) {
                free(dummy);
              }
              manager_local = (DdManager *)0xbff0000000000000;
            }
            else {
              manager_local = (DdManager *)pmin;
            }
          }
        }
        else {
          manager_local = (DdManager *)0xbff0000000000000;
        }
      }
      else {
        manager_local = (DdManager *)0xbff0000000000000;
      }
    }
    else {
      manager_local = *(DdManager **)local_70;
    }
  }
  return (double)manager_local;
}

Assistant:

static double
bddAnnotateMintermCount(
  DdManager * manager,
  DdNode * node,
  double  max,
  st__table * table)
{

    DdNode *N,*Nv,*Nnv;
    register double min_v,min_nv;
    register double min_N;
    double *pmin;
    double *dummy;

    statLine(manager);
    N = Cudd_Regular(node);
    if (cuddIsConstant(N)) {
        if (node == DD_ONE(manager)) {
            return(max);
        } else {
            return(0.0);
        }
    }

    if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
        return(*dummy);
    }   
  
    Nv = cuddT(N);
    Nnv = cuddE(N);
    if (N != node) {
        Nv = Cudd_Not(Nv);
        Nnv = Cudd_Not(Nnv);
    }

    /* Recur on the two branches. */
    min_v  = bddAnnotateMintermCount(manager,Nv,max,table) / 2.0;
    if (min_v == (double)CUDD_OUT_OF_MEM)
        return ((double)CUDD_OUT_OF_MEM);
    min_nv = bddAnnotateMintermCount(manager,Nnv,max,table) / 2.0;
    if (min_nv == (double)CUDD_OUT_OF_MEM)
        return ((double)CUDD_OUT_OF_MEM);
    min_N  = min_v + min_nv;

    pmin = ABC_ALLOC(double,1);
    if (pmin == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return((double)CUDD_OUT_OF_MEM);
    }
    *pmin = min_N;

    if ( st__insert(table,(char *)node, (char *)pmin) == st__OUT_OF_MEM) {
        ABC_FREE(pmin);
        return((double)CUDD_OUT_OF_MEM);
    }
    
    return(min_N);

}